

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

longlong get_int(shared_ptr<SchemeObject> *p,string *error_msg)

{
  longlong lVar1;
  bool bVar2;
  element_type *peVar3;
  eval_error *this;
  undefined1 local_28 [8];
  shared_ptr<SchemeInt> pi;
  string *error_msg_local;
  shared_ptr<SchemeObject> *p_local;
  
  pi.super___shared_ptr<SchemeInt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)error_msg;
  std::dynamic_pointer_cast<SchemeInt,SchemeObject>((shared_ptr<SchemeObject> *)local_28);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (!bVar2) {
    this = (eval_error *)__cxa_allocate_exception(0x10);
    eval_error::runtime_error
              (this,(string *)
                    pi.super___shared_ptr<SchemeInt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    __cxa_throw(this,&eval_error::typeinfo,eval_error::~eval_error);
  }
  peVar3 = std::__shared_ptr_access<SchemeInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<SchemeInt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_28);
  lVar1 = peVar3->value;
  std::shared_ptr<SchemeInt>::~shared_ptr((shared_ptr<SchemeInt> *)local_28);
  return lVar1;
}

Assistant:

static long long get_int(std::shared_ptr<SchemeObject> p, const std::string &error_msg)
{
    auto pi = std::dynamic_pointer_cast<SchemeInt>(p);
    if(pi)
        return pi->value;
    throw eval_error(error_msg);
}